

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddSlotIdInCachedScopeToNestedIndexArray
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *functionBody)

{
  uint32 uVar1;
  uint32 uVar2;
  uint *puVar3;
  ulong uVar4;
  
  puVar3 = (uint *)FunctionProxy::GetAuxPtr
                             ((FunctionProxy *)functionBody,SlotIdInCachedScopeToNestedIndexArray);
  uVar1 = PrependInt32(this,builder,L"SlotIdInCachedScopeToNestedIndexArray count",*puVar3,
                       (BufferBuilderInt32 **)0x0);
  if (*puVar3 != 0) {
    uVar4 = 0;
    do {
      uVar2 = PrependInt32(this,builder,L"Nested function index for slot id in cached scope",
                           puVar3[uVar4 + 1],(BufferBuilderInt32 **)0x0);
      uVar1 = uVar1 + uVar2;
      uVar4 = uVar4 + 1;
    } while (uVar4 < *puVar3);
  }
  return uVar1;
}

Assistant:

uint32 AddSlotIdInCachedScopeToNestedIndexArray(BufferBuilderList& builder, FunctionBody * functionBody)
    {
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start SlotIdInCachedScopeToNestedIndexArray"), magicStartOfSlotIdToNestedIndexArray);
#endif

        Js::AuxArray<uint32> * slotIdToNestedIndexArray = functionBody->GetSlotIdInCachedScopeToNestedIndexArray();
        size += PrependInt32(builder, _u("SlotIdInCachedScopeToNestedIndexArray count"), slotIdToNestedIndexArray->count);
        for (uint i = 0; i < slotIdToNestedIndexArray->count; i++)
        {
            size += PrependInt32(builder, _u("Nested function index for slot id in cached scope"), slotIdToNestedIndexArray->elements[i]);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End magicStartOfSlotIdToNestedIndexArray"), magicEndOfSlotIdToNestedIndexArray);
#endif
        return size;
    }